

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_debug.c
# Opt level: O2

int cmd_debug_store(ly_ctx **ctx,yl_opt *yo,char *posv)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  if (posv == (char *)0x0) {
    __assert_fail("posv",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/tools/lint/cmd_debug.c"
                  ,0x6a,"int cmd_debug_store(struct ly_ctx **, struct yl_opt *, const char *)");
  }
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0x40) {
      yl_log('\x01',"Unknown debug group \"%s\".",posv);
      return 1;
    }
    iVar2 = strcasecmp(posv,*(char **)((long)&dg[0].name + lVar3));
    lVar1 = lVar3 + 0x10;
  } while (iVar2 != 0);
  yo->dbg_groups = yo->dbg_groups | *(uint *)((long)&dg[0].flag + lVar3);
  return 0;
}

Assistant:

int
cmd_debug_store(struct ly_ctx **ctx, struct yl_opt *yo, const char *posv)
{
    (void) ctx;
    uint32_t i;
    ly_bool set;

    assert(posv);

    set = 0;
    for (i = 0; i < DG_LENGTH; i++) {
        if (!strcasecmp(posv, dg[i].name)) {
            yo->dbg_groups |= dg[i].flag;
            set = 1;
            break;
        }
    }

    if (!set) {
        YLMSG_E("Unknown debug group \"%s\".", posv);
        return 1;
    }

    return 0;
}